

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O3

void __thiscall Room::Room(Room *this,RoomID idnum,string *i_description)

{
  this->_vptr_Room = (_func_int **)&PTR_describe_abi_cxx11__00113d88;
  this->ID = idnum;
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  (this->entities).
  super__Vector_base<std::unique_ptr<Entity,_std::default_delete<Entity>_>,_std::allocator<std::unique_ptr<Entity,_std::default_delete<Entity>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entities).
  super__Vector_base<std::unique_ptr<Entity,_std::default_delete<Entity>_>,_std::allocator<std::unique_ptr<Entity,_std::default_delete<Entity>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->entities).
  super__Vector_base<std::unique_ptr<Entity,_std::default_delete<Entity>_>,_std::allocator<std::unique_ptr<Entity,_std::default_delete<Entity>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->objects).super__Vector_base<RoomObject,_std::allocator<RoomObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objects).super__Vector_base<RoomObject,_std::allocator<RoomObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objects).super__Vector_base<RoomObject,_std::allocator<RoomObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->exits)._M_h._M_buckets = &(this->exits)._M_h._M_single_bucket;
  (this->exits)._M_h._M_bucket_count = 1;
  (this->exits)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->exits)._M_h._M_element_count = 0;
  (this->exits)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->exits)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->exits)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::_M_assign((string *)&this->description);
  return;
}

Assistant:

Room::Room(RoomID idnum, std::string i_description) : ID(idnum)
{
  description = i_description;
}